

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

void __thiscall FString::FString(FString *this,char *copyStr)

{
  size_t strlen;
  FStringData *pFVar1;
  
  if ((copyStr == (char *)0x0) || (*copyStr == '\0')) {
    NullString.RefCount = NullString.RefCount + 1;
    this->Chars = (char *)0x723dac;
  }
  else {
    strlen = ::strlen(copyStr);
    pFVar1 = FStringData::Alloc(strlen);
    this->Chars = (char *)(pFVar1 + 1);
    pFVar1->Len = (uint)strlen;
    memcpy(pFVar1 + 1,copyStr,strlen);
    *(undefined1 *)((long)&pFVar1[1].Len + strlen) = 0;
  }
  return;
}

Assistant:

FString::FString (const char *copyStr)
{
	if (copyStr == NULL || *copyStr == '\0')
	{
		NullString.RefCount++;
		Chars = &NullString.Nothing[0];
	}
	else
	{
		size_t len = strlen (copyStr);
		AllocBuffer (len);
		StrCopy (Chars, copyStr, len);
	}
}